

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::ToArrayFromString
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *string_path,string *caller_name,uint8_t depth)

{
  char cVar1;
  long lVar2;
  iterator __position;
  bool bVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  int iVar5;
  ulong uVar6;
  CfdException *pCVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  string str;
  char *p_str_end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  char *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._0_8_ = local_98 + 0x10;
  local_58 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/","");
  StringUtil::Split(&local_48,(string *)string_path,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      local_98._0_8_ = local_98 + 0x10;
      lVar2 = *(long *)((long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,lVar2,
                 *(long *)((long)&((local_48.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar10) + lVar2);
      if (CONCAT44(local_98._12_4_,local_98._8_4_) < 2) {
LAB_0043d59a:
        bVar3 = false;
      }
      else {
        cVar1 = *(char *)(local_98._0_8_ + (CONCAT44(local_98._12_4_,local_98._8_4_) - 1));
        if (((cVar1 != '\'') && (cVar1 != 'h')) && (cVar1 != 'H')) goto LAB_0043d59a;
        ::std::__cxx11::string::substr((ulong)local_78,(ulong)local_98);
        ::std::__cxx11::string::operator=((string *)local_98,(string *)local_78);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_);
        }
        bVar3 = true;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)local_98);
      if (iVar5 == 0) {
LAB_0043d64a:
        if (depth != '\0') {
          local_78._0_8_ = "cfdcore_hdwallet.cpp";
          local_78._8_4_ = 0xb8;
          local_78._16_8_ = "ToArrayFromString";
          logger::log<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                     "{} bip32 path fail. this key is not master key.",caller_name);
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,caller_name," bip32 path fail. this key is not master key.");
          CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_78);
          __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)local_98);
        if (iVar5 == 0) goto LAB_0043d64a;
        if (CONCAT44(local_98._12_4_,local_98._8_4_) == 0) {
          if (uVar9 != 0) {
            local_78._0_8_ = "cfdcore_hdwallet.cpp";
            local_78._8_4_ = 0xc6;
            local_78._16_8_ = "ToArrayFromString";
            logger::log<std::__cxx11::string_const&>
                      ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                       "{} bip32 string path fail. empty item.",caller_name);
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78,caller_name," bip32 string path fail. empty item.");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_78);
            __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        else {
          local_50 = (char *)0x0;
          if (((CONCAT44(local_98._12_4_,local_98._8_4_) < 3) || (*(char *)local_98._0_8_ != '0'))
             || (*(char *)(local_98._0_8_ + 1) != 'x')) {
            iVar5 = 10;
          }
          else {
            iVar5 = 0x10;
          }
          uVar6 = strtoul((char *)local_98._0_8_,&local_50,iVar5);
          if ((CONCAT44(local_98._12_4_,local_98._8_4_) == 0) ||
             ((local_50 != (char *)0x0 && (*local_50 != '\0')))) {
            local_78._0_8_ = "cfdcore_hdwallet.cpp";
            local_78._8_4_ = 0xd7;
            local_78._16_8_ = "ToArrayFromString";
            logger::log<std::__cxx11::string_const&>
                      ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                       "{} bip32 string path fail.",caller_name);
            pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_78,caller_name," bip32 string path fail.");
            CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_78);
            __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
          }
          uVar8 = (uint)uVar6 | 0x80000000;
          if (!bVar3) {
            uVar8 = (uint)uVar6;
          }
          local_78._0_4_ = uVar8;
          __position._M_current =
               (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_58,__position,(uint *)local_78);
          }
          else {
            *__position._M_current = uVar8;
            (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (uVar9 < (ulong)((long)local_48.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pvVar4 = local_58;
  if ((local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    return pvVar4;
  }
  local_98._0_8_ = "cfdcore_hdwallet.cpp";
  local_98._8_4_ = 0xe1;
  local_98._16_8_ = "ToArrayFromString";
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"{} bip32 string path empty.",
             caller_name);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   caller_name," bip32 string path empty.");
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_98);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static std::vector<uint32_t> ToArrayFromString(
    const std::string& string_path, const std::string& caller_name,
    uint8_t depth) {
  std::vector<uint32_t> result;
  std::vector<std::string> list = StringUtil::Split(string_path, "/");
  for (size_t index = 0; index < list.size(); ++index) {
    std::string str = list[index];
    bool hardened = false;
    if (str.size() <= 1) {
      // do nothing
    } else if (
        (str.back() == '\'') || (str.back() == 'h') || (str.back() == 'H')) {
      str = str.substr(0, str.size() - 1);
      hardened = true;
    }
    if ((str == "m") || (str == "M")) {
      if (depth != 0) {
        warn(
            CFD_LOG_SOURCE, "{} bip32 path fail. this key is not master key.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 path fail. this key is not master key.");
      }
      continue;  // master key
    }
    if (str.empty()) {
      if (index == 0) {
        // start slash pattern
        continue;
      } else {
        warn(
            CFD_LOG_SOURCE, "{} bip32 string path fail. empty item.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 string path fail. empty item.");
      }
    }

    // Conversion by strtol function
    char* p_str_end = nullptr;
    uint32_t value;
    if ((str.size() > 2) && (str[0] == '0') && (str[1] == 'x')) {
      value = std::strtoul(str.c_str(), &p_str_end, 16);
    } else {
      value = std::strtoul(str.c_str(), &p_str_end, 10);
    }
    if (str.empty() || ((p_str_end != nullptr) && (*p_str_end != '\0'))) {
      warn(CFD_LOG_SOURCE, "{} bip32 string path fail.", caller_name);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          caller_name + " bip32 string path fail.");
    }
    if (hardened) value |= 0x80000000;
    result.push_back(static_cast<uint32_t>(value));
  }

  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "{} bip32 string path empty.", caller_name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " bip32 string path empty.");
  }

  return result;
}